

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  FILE *__stream;
  int iVar2;
  int iVar3;
  uint setupID;
  long val;
  int iVar4;
  char *pcVar5;
  float_type fVar6;
  double dVar7;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM2_Qb;
  float_type Sc;
  uint setup_id;
  uint border_cpml_width;
  double local_288;
  char *local_280;
  float_type end_time;
  float_type smallest_wavelength;
  double local_268;
  size_t num_iterations;
  float_type domain_size [3];
  time_measure endTime;
  time_measure startTime;
  fdtd fdtd;
  
  smallest_wavelength = 4.5e-07;
  domain_size[2] = 1e-05;
  Sc = -1.0;
  border_cpml_width = 0x14;
  setup_id = 0;
  end_time = -1.0;
  domain_size[0] = 1e-05;
  domain_size[1] = 1e-05;
  num_iterations = 400;
  local_288 = (double)CONCAT44(local_288._4_4_,(int)CONCAT71((int7)((ulong)&num_iterations >> 8),1))
  ;
  local_280 = (char *)0x0;
  iVar2 = 1;
LAB_001012d1:
  iVar4 = iVar2;
  iVar3 = getopt_long(argc,argv,":123s:x:y:z:o:c:w:a:t:i:hq",opt_options,0);
  iVar2 = iVar4;
  switch(iVar3) {
  case 0x61:
    iVar3 = __isoc99_sscanf(_optarg,"%u",&border_cpml_width);
    if (1 < iVar3 + 1U) goto LAB_001012d1;
    fprintf(_stderr,"Please enter a positive integer for the cpml thickness instead of \"-%c %s\"\n"
            ,0x61,_optarg);
    border_cpml_width = 0x14;
    break;
  case 0x62:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x72:
  case 0x75:
  case 0x76:
    break;
  case 99:
    iVar3 = __isoc99_sscanf(_optarg,"%lf",&Sc);
    if ((1 < iVar3 + 1U) && (0.0 <= Sc)) goto LAB_001012d1;
    fprintf(_stderr,
            "Please enter a positive floating point number for the Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n"
            ,99,_optarg);
    Sc = -1.0;
    break;
  case 0x68:
    printf("Usage: %s <options>\n%s\n",*argv,
           "Options:\n  -1 --one-dimensional     : 1D solver\n  -2 --one-dimensional     : 2D solver\n  -3 --one-dimensional     : 3D solver\n  -s --setup-id            : Predefined problem identifier\n                             1D : 0 - Half air half water, left-to-right gaussian\n                             2D : 0 - West air east water, west-to-east gaussian\n                                  1 - Air with high permittivity centered object, west pulse\n                                  2 - Centered gaussian excitation in free space\n                             3D : 0 - Half air half water, west-to-east gaussian\n                                  1 - Air with high permittivity centered object\n  -x --size-x              : Size of the domain (e.g. 0.00001)\n  -y --size-y              : Size of the domain (e.g. 0.00001)\n  -z --size-z              : Size of the domain (e.g. 0.00001)\n  -o --output              : Select the output file name\n  -c --courant-friedrichs-levy-condition : Stability value\n  -w --smallest-wavelength : Smallest wavelength in the simulation\n  -a --cpml-absorbing-thickness  : Size of the absorbing boundary wall\n  -t --stop-sim-time       : Stop the simulation when the time is reached\n  -i --num-iterations      : Stop the simulation after the specified amount of solver iterations\n  -h --help                : Print this help\n  -q --quiet               : Do not print information to the user from inside the main kernel"
          );
    return 0;
  case 0x69:
    iVar3 = __isoc99_sscanf(_optarg,"%zu",&num_iterations);
    if (1 < iVar3 + 1U) goto LAB_001012d1;
    fprintf(_stderr,
            "Please enter a positive integer for the number of iterations instead of \"-%c %s\"\n",
            0x69,_optarg);
    num_iterations = 0;
    break;
  case 0x6f:
    local_280 = "gridData.dat";
    if ((_optarg == (char *)0x0) || ((*_optarg != '-' && (local_280 = _optarg, *_optarg != '\0'))))
    goto LAB_001012d1;
    _optind = _optind + -1;
    local_280 = "gridData.dat";
    break;
  case 0x71:
    local_288 = (double)((ulong)local_288 & 0xffffffff00000000);
    break;
  case 0x73:
    iVar3 = __isoc99_sscanf(_optarg,"%u",&setup_id);
    if (1 < iVar3 + 1U) goto LAB_001012d1;
    fprintf(_stderr,"Please enter a positive integer for the setup id instead of \"-%c %s\"\n",0x73,
            _optarg);
    setup_id = 0;
    break;
  case 0x74:
    iVar3 = __isoc99_sscanf(_optarg,"%lf",&end_time);
    if ((1 < iVar3 + 1U) && (0.0 <= end_time)) goto LAB_001012d1;
    fprintf(_stderr,
            "Please enter a positive floating point number for the simulation end time instead of \"-%c %s\"\n"
            ,0x74,_optarg);
    end_time = -1.0;
    break;
  case 0x77:
    iVar3 = __isoc99_sscanf(_optarg,"%lf",&smallest_wavelength);
    if ((1 < iVar3 + 1U) && (0.0 <= smallest_wavelength)) goto LAB_001012d1;
    fprintf(_stderr,
            "Please enter a positive floating point number for the Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n"
            ,0x77,_optarg);
    smallest_wavelength = 4.5e-07;
    break;
  case 0x78:
    iVar3 = __isoc99_sscanf(_optarg,"%lf",domain_size);
    if ((1 < iVar3 + 1U) && (0.0 <= domain_size[0])) goto LAB_001012d1;
    fprintf(_stderr,
            "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
            ,0x78,_optarg);
    domain_size[0] = 1e-05;
    break;
  case 0x79:
    iVar3 = __isoc99_sscanf(_optarg,"%lf",domain_size + 1);
    if ((1 < iVar3 + 1U) && (0.0 <= domain_size[1])) goto LAB_001012d1;
    fprintf(_stderr,
            "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
            ,0x79,_optarg);
    domain_size[1] = 1e-05;
    break;
  case 0x7a:
    iVar3 = __isoc99_sscanf(_optarg,"%lf",domain_size + 2);
    if ((1 < iVar3 + 1U) && (0.0 <= domain_size[2])) goto LAB_001012d1;
    fprintf(_stderr,
            "Please enter a positive floating point number for the domain size instead of \"-%c %s\"\n"
            ,0x7a,_optarg);
    domain_size[2] = 1e-05;
    break;
  default:
    iVar2 = 1;
    if (iVar3 != 0x31) {
      if (iVar3 == 0x32) {
        iVar2 = 2;
      }
      else {
        if (iVar3 != 0x33) goto code_r0x0010136f;
        iVar2 = 3;
      }
    }
    goto LAB_001012d1;
  }
  goto LAB_001012d1;
code_r0x0010136f:
  iVar2 = iVar4;
  if (iVar3 == -1) goto LAB_00101759;
  goto LAB_001012d1;
LAB_00101759:
  if (iVar4 == 3) {
    if (1 < setup_id) {
      pcVar5 = "The input setup id %u does not map to any available 3D setup\n";
      goto LAB_00101961;
    }
    setupID = setup_id | 6;
    if ((Sc == -1.0) && (!NAN(Sc))) {
      Sc = 0.5;
    }
  }
  else if (iVar4 == 2) {
    if (2 < setup_id) {
      pcVar5 = "The input setup id %u does not map to any available 2D setup\n";
LAB_00101961:
      fprintf(_stderr,pcVar5,(ulong)setup_id);
      exit(1);
    }
    setupID = setup_id + 2;
    if ((Sc == -1.0) && (!NAN(Sc))) {
      Sc = 0.5773502691896258;
    }
  }
  else {
    if (setup_id != 0) {
      pcVar5 = "The input setup id %u does not map to any available 1D setup\n";
      goto LAB_00101961;
    }
    setupID = 0;
    if ((Sc == -1.0) && (setupID = 0, !NAN(Sc))) {
      Sc = 1.0;
      setupID = 0;
    }
  }
  initializeFdtd_cmpl(&fdtd,setupID,domain_size,Sc,smallest_wavelength,(ulong)border_cpml_width);
  local_268 = end_time;
  if (end_time <= 0.0) {
    auVar1._8_8_ = in_XMM2_Qb;
    auVar1._0_8_ = in_XMM2_Qa;
    auVar1 = vcvtusi2sd_avx512f(auVar1,num_iterations);
    local_268 = auVar1._0_8_;
    fVar6 = get_time_step_fdtd(&fdtd);
    local_268 = fVar6 * local_268;
  }
  clock_gettime(4,(timespec *)&startTime);
  run_fdtd(&fdtd,local_268,(_Bool)(local_288._0_1_ & 1));
  clock_gettime(4,(timespec *)&endTime);
  pcVar5 = local_280;
  __stream = _stdout;
  if (endTime.tv_nsec < startTime.tv_nsec) {
    local_288 = (double)((endTime.tv_nsec - startTime.tv_nsec) + 1000000000) / 1000000000.0 + -1.0;
  }
  else {
    local_288 = (double)(endTime.tv_nsec - startTime.tv_nsec) / 1000000000.0;
  }
  dVar7 = difftime(endTime.tv_sec,startTime.tv_sec);
  fprintf(__stream,"Kernel time %.4fs\n",dVar7 + local_288);
  if (pcVar5 != (char *)0x0) {
    dump_fdtd(&fdtd,pcVar5,dump_ez);
  }
  free_fdtd(&fdtd);
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  float_type domain_size[3] = {default_domain_size, default_domain_size,
                               default_domain_size};
  char *output_filename = NULL;
  float_type Sc = default_Sc;
  float_type smallest_wavelength = default_smallest_wavelength;
  unsigned border_cpml_width = default_cpml_width;
  unsigned dimension = 1;
  unsigned setup_id = 0; // Default to the first one for each the dimension
  float_type end_time = default_end_time;
  size_t num_iterations = default_iteration_count;
  bool verbose = true;

  while (true) {
    int sscanf_return;
    int optchar = getopt_long(argc, argv, options, opt_options, NULL);
    if (optchar == -1)
      break;
    switch (optchar) {
    case '1':
      dimension = 1;
      break;
    case '2':
      dimension = 2;
      break;
    case '3':
      dimension = 3;
      break;
    case 'o':
      if (optarg != NULL && optarg[0] != '-' && optarg[0] != '\0') {
        output_filename = optarg;
      } else {
        output_filename = "gridData.dat";
        if (optarg != NULL)
          optind--;
      }
      break;
    case 'q':
      verbose = false;
      break;
    case 'x':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[0]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[0]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[0] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[0] = default_domain_size;
      }
      break;
    case 'y':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[1]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[1]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[1] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[1] = default_domain_size;
      }
      break;
    case 'z':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &domain_size[2]);
#else
      sscanf_return = sscanf(optarg, "%f", &domain_size[2]);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          domain_size[2] < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the domain "
                "size instead of \"-%c %s\"\n",
                optchar, optarg);
        domain_size[2] = default_domain_size;
      }
      break;
    case 'a':
      sscanf_return = sscanf(optarg, "%u", &border_cpml_width);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the cpml thickness "
                "instead of \"-%c %s\"\n",
                optchar, optarg);
        border_cpml_width = default_cpml_width;
      }
      break;
    case 's':
      sscanf_return = sscanf(optarg, "%u", &setup_id);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the setup id instead of "
                "\"-%c %s\"\n",
                optchar, optarg);
        setup_id = 0;
      }
      break;
    case 'i':
      sscanf_return = sscanf(optarg, "%zu", &num_iterations);
      if (sscanf_return == EOF || sscanf_return == 0) {
        fprintf(stderr,
                "Please enter a positive integer for the number of iterations "
                "instead of "
                "\"-%c %s\"\n",
                optchar, optarg);
        num_iterations = 0;
      }
      break;
    case 'c':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &Sc);
#else
      sscanf_return = sscanf(optarg, "%f", &Sc);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 || Sc < float_cst(0.)) {
        fprintf(
            stderr,
            "Please enter a positive floating point number for the "
            "Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n",
            optchar, optarg);
        Sc = default_Sc;
      }
      break;
    case 't':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &end_time);
#else
      sscanf_return = sscanf(optarg, "%f", &end_time);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          end_time < float_cst(0.)) {
        fprintf(stderr,
                "Please enter a positive floating point number for the "
                "simulation end time instead of \"-%c %s\"\n",
                optchar, optarg);
        end_time = default_end_time;
      }
      break;
    case 'w':
#if float_type == double
      sscanf_return = sscanf(optarg, "%lf", &smallest_wavelength);
#else
      sscanf_return = sscanf(optarg, "%f", &smallest_wavelength);
#endif
      if (sscanf_return == EOF || sscanf_return == 0 ||
          smallest_wavelength < float_cst(0.)) {
        fprintf(
            stderr,
            "Please enter a positive floating point number for the "
            "Courant-Friedrichs-Levy stability value instead of \"-%c %s\"\n",
            optchar, optarg);
        smallest_wavelength = default_smallest_wavelength;
      }
      break;
    case 'h':
      printf("Usage: %s <options>\n%s\n", argv[0], help_string);
      return EXIT_SUCCESS;
    }
  }

  unsigned initialize_setup_id;
  switch (dimension) {
  case 1: {
    if (setup_id >= last_1D_setup) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 1D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id;
    if (Sc == default_Sc) {
      Sc = float_cst(1.);
    }
  } break;
  case 2: {
    if (setup_id >= last_2D_setup - last_1D_setup - 1) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 2D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id + last_1D_setup + 1;
    if (Sc == default_Sc) {
      Sc = float_cst(1.) / sqrt(float_cst(3.));
    }
  } break;
  case 3: {
    if (setup_id >= last_3D_setup - last_2D_setup - 1) {
      fprintf(stderr,
              "The input setup id %u does not map to any available 3D setup\n",
              setup_id);
      exit(EXIT_FAILURE);
    }
    initialize_setup_id = setup_id + last_2D_setup + 1;
    if (Sc == default_Sc) {
      Sc = float_cst(1.) / sqrt(float_cst(4.));
    }
  } break;
  }

  struct fdtd fdtd =
      initializeFdtd_cmpl(initialize_setup_id, domain_size, Sc,
                          smallest_wavelength, border_cpml_width);

  float_type stop_time;
  if (end_time > float_cst(0.)) {
    stop_time = end_time;
  } else {
    stop_time = (float_type)num_iterations * get_time_step_fdtd(&fdtd);
  }
  time_measure startTime, endTime;
  get_current_time(&startTime);
  run_fdtd(&fdtd, stop_time, verbose);
  get_current_time(&endTime);
  fprintf(stdout, "Kernel time %.4fs\n",
          measuring_difftime(startTime, endTime));
  if (output_filename) {
    dump_fdtd(&fdtd, output_filename, dump_ez);
  }
  free_fdtd(&fdtd);

  return EXIT_SUCCESS;
}